

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O2

void __thiscall Editor::deleteArea(Editor *this)

{
  Editor *pEVar1;
  bool bVar2;
  uint uVar3;
  Blank *type;
  _Rb_tree_color _Var4;
  pointer *__ptr;
  uint uVar5;
  int i;
  _Rb_tree_color tileIndex;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> pVar10;
  Tile tile;
  undefined1 local_b8 [36];
  int local_94;
  Editor *local_90;
  Board *local_88;
  _Base_ptr local_80;
  Chunk *local_78;
  _Head_base<0UL,_gui::Gui_*,_false> local_70;
  _Head_base<0UL,_gui::Theme_*,_false> local_68;
  Tile local_60;
  Tile local_48;
  
  pVar10 = Board::getHighlightedBounds(this->board_);
  iVar8 = pVar10.first.x;
  iVar7 = pVar10.second.x;
  if (iVar8 <= iVar7) {
    makeCommand<commands::FillArea,Board&,TilePool&>
              ((Editor *)local_b8,(Board *)this,(TilePool *)this->board_);
    local_88 = this->board_;
    local_68._M_head_impl = (Theme *)((ulong)pVar10.first >> 0x20);
    local_70._M_head_impl = (Gui *)((ulong)pVar10.second >> 0x20);
    local_b8._12_4_ = pVar10.second.y >> 5;
    local_b8._8_4_ = iVar8 >> 5;
    local_b8._20_4_ = iVar7 >> 5;
    uVar3 = pVar10.first.y >> 5;
    local_90 = this;
    while (pEVar1 = local_90, local_60.tileType_ = (TileType *)local_b8._0_8_,
          (int)uVar3 <= (int)local_b8._12_4_) {
      local_80 = (_Base_ptr)((ulong)(uVar3 | 0x80000000) << 0x20);
      local_b8._28_4_ = uVar3 << 5;
      uVar5 = local_b8._8_4_;
      local_b8._16_4_ = uVar3;
      while ((int)uVar5 <= (int)local_b8._20_4_) {
        local_78 = Board::accessChunk(local_88,(ulong)(uVar5 | 0x80000000) | (ulong)local_80);
        uVar6 = 0;
        local_b8._24_4_ = uVar5;
        while (tileIndex = (_Rb_tree_color)uVar6, tileIndex != 0x400) {
          _Var4 = tileIndex & 0x1f | uVar5 << 5;
          if ((((iVar8 <= (int)_Var4) && ((int)_Var4 <= iVar7)) &&
              (iVar9 = (int)(uVar6 >> 5) + local_b8._28_4_, (int)local_68._M_head_impl <= iVar9)) &&
             (iVar9 <= (int)local_70._M_head_impl)) {
            Chunk::accessTile(&local_60,local_78,tileIndex);
            bVar2 = Tile::getHighlight(&local_60);
            if (bVar2) {
              local_b8._32_4_ = _Var4;
              local_94 = iVar9;
              commands::PlaceTiles::pushBackTile
                        (&local_48,(PlaceTiles *)local_b8._0_8_,(Vector2i *)(local_b8 + 0x20));
              type = tiles::Blank::instance();
              Tile::setType(&local_48,type);
            }
          }
          uVar6 = (ulong)(tileIndex + _S_black);
        }
        uVar5 = local_b8._24_4_ + 1;
      }
      uVar3 = local_b8._16_4_ + 1;
    }
    local_b8._0_8_ = (_func_int **)0x0;
    executeCommand(local_90,(unique_ptr<Command,_std::default_delete<Command>_> *)&local_60);
    if ((element_type *)local_60.tileType_ != (element_type *)0x0) {
      (*(((Widget *)&(local_60.tileType_)->_vptr_TileType)->super_Drawable)._vptr_Drawable[1])();
    }
    Board::removeAllHighlights(pEVar1->board_);
    if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_b8._0_8_ + 8))();
    }
  }
  return;
}

Assistant:

void Editor::deleteArea() {
    auto bounds = board_.getHighlightedBounds();
    if (bounds.first.x > bounds.second.x) {
        return;
    }
    auto command = makeCommand<commands::FillArea>(board_, tilePool_);
    forEachTile(board_, bounds.first, bounds.second, [&command](Chunk& chunk, int i, int x, int y) {
        Tile tile = chunk.accessTile(i);
        if (tile.getHighlight()) {
            command->pushBackTile({x, y}).setType(tiles::Blank::instance());
        }
    });
    executeCommand(std::move(command));
    board_.removeAllHighlights();
}